

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWO2PolygonTags(LWOImporter *this,uint length)

{
  uint8_t **inout;
  ushort uVar1;
  uint *puVar2;
  Layer *pLVar3;
  pointer pFVar4;
  int iVar5;
  uint *puVar6;
  ulong uVar7;
  Logger *this_00;
  DeadlyImportError *this_01;
  uint uVar8;
  uint uVar9;
  allocator local_49;
  string local_48;
  
  if (3 < length) {
    inout = &this->mFileBuffer;
    puVar2 = (uint *)this->mFileBuffer;
    uVar9 = *puVar2;
    puVar6 = puVar2 + 1;
    *inout = (uint8_t *)puVar6;
    uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    if ((uVar9 == 0x53555246) || (uVar9 == 0x534d4750)) {
      while (puVar6 < (uint *)((long)puVar2 + (ulong)length)) {
        iVar5 = ReadVSizedIntLWO2(this,inout);
        pLVar3 = this->mCurLayer;
        uVar7 = (ulong)(iVar5 + pLVar3->mFaceIDXOfs);
        uVar1 = *(ushort *)this->mFileBuffer;
        this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 2);
        pFVar4 = (pLVar3->mFaces).
                 super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar7 < (ulong)((long)(pLVar3->mFaces).
                                  super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 5)) {
          uVar8 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
          if (uVar9 == 0x534d4750) {
            pFVar4[uVar7].smoothGroup = uVar8;
          }
          else if (uVar9 == 0x53555246) {
            pFVar4[uVar7].surfaceIndex = uVar8;
          }
        }
        else {
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,"LWO2: face index in PTAG is out of range");
        }
        puVar6 = (uint *)*inout;
      }
    }
    return;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_48,"LWO: PTAG chunk is too small",&local_49);
  DeadlyImportError::DeadlyImportError(this_01,&local_48);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::LoadLWO2PolygonTags(unsigned int length)
{
    LE_NCONST uint8_t* const end = mFileBuffer+length;

    AI_LWO_VALIDATE_CHUNK_LENGTH(length,PTAG,4);
    uint32_t type = GetU4();

    if (type != AI_LWO_SURF && type != AI_LWO_SMGP)
        return;

    while (mFileBuffer < end)
    {
        unsigned int i = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mFaceIDXOfs;
        unsigned int j = GetU2();

        if (i >= mCurLayer->mFaces.size())  {
            ASSIMP_LOG_WARN("LWO2: face index in PTAG is out of range");
            continue;
        }

        switch (type)   {

        case AI_LWO_SURF:
            mCurLayer->mFaces[i].surfaceIndex = j;
            break;
        case AI_LWO_SMGP: /* is that really used? */
            mCurLayer->mFaces[i].smoothGroup = j;
            break;
        };
    }
}